

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::LPFwriteSVector<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<double> *p_svec,bool writeZeroCoefficients)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ostream *in_RSI;
  byte in_R8B;
  SPxLPBase<double> *p_lp_00;
  double coeff;
  int j;
  int num_coeffs;
  char name [16];
  ostream *in_stack_ffffffffffffffa0;
  NameSet *in_stack_ffffffffffffffa8;
  int p_idx;
  int local_40;
  int local_3c;
  
  local_3c = 0;
  local_40 = 0;
  while (p_idx = local_40, iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x1b3573),
        p_idx < iVar1) {
    p_lp_00 = (SPxLPBase<double> *)
              SVectorBase<double>::operator[]
                        ((SVectorBase<double> *)in_stack_ffffffffffffffa8,
                         (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    if ((((double)p_lp_00 != 0.0) || (NAN((double)p_lp_00))) || ((in_R8B & 1) != 0)) {
      if (local_3c == 0) {
        poVar2 = (ostream *)std::ostream::operator<<(in_RSI,(double)p_lp_00);
        in_stack_ffffffffffffffa8 = (NameSet *)std::operator<<(poVar2," ");
        pcVar3 = getColName<double>(p_lp_00,p_idx,in_stack_ffffffffffffffa8,
                                    (char *)in_stack_ffffffffffffffa0);
        std::operator<<((ostream *)in_stack_ffffffffffffffa8,pcVar3);
      }
      else {
        if (local_3c % 5 == 0) {
          std::operator<<(in_RSI,"\n\t");
        }
        if (0.0 <= (double)p_lp_00) {
          poVar2 = std::operator<<(in_RSI," + ");
          std::ostream::operator<<(poVar2,(double)p_lp_00);
        }
        else {
          poVar2 = std::operator<<(in_RSI," - ");
          std::ostream::operator<<(poVar2,-(double)p_lp_00);
        }
        in_stack_ffffffffffffffa0 = std::operator<<(in_RSI," ");
        pcVar3 = getColName<double>(p_lp_00,p_idx,in_stack_ffffffffffffffa8,
                                    (char *)in_stack_ffffffffffffffa0);
        std::operator<<(in_stack_ffffffffffffffa0,pcVar3);
      }
      local_3c = local_3c + 1;
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}